

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

int Curl_resolv_getsock(Curl_easy *data,curl_socket_t *socks)

{
  thread_sync_data *ptVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  ulong milli;
  int iVar5;
  curltime cVar6;
  curltime newer;
  curltime older;
  
  if (((data->conn->bits).field_0x3 & 2) != 0) {
    return 0;
  }
  if (((data->state).async.thdata.init == true) &&
     (ptVar1 = (data->state).async.thdata.tsd, ptVar1 != (thread_sync_data *)0x0)) {
    *socks = ptVar1->sock_pair[0];
    iVar5 = 1;
  }
  else {
    cVar6 = Curl_now();
    uVar2 = (data->state).async.thdata.start.tv_sec;
    uVar3 = (data->state).async.thdata.start.tv_usec;
    older.tv_usec = uVar3;
    older.tv_sec = uVar2;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar6._0_12_,0);
    newer.tv_usec = SUB124(cVar6._0_12_,8);
    older._12_4_ = 0;
    uVar4 = Curl_timediff(newer,older);
    iVar5 = 0;
    if ((long)uVar4 < 3) {
      milli = 0;
    }
    else if (uVar4 < 0x33) {
      milli = (ulong)(((uint)uVar4 & 0xff) / 3);
    }
    else {
      milli = 200;
      if (uVar4 < 0xfb) {
        milli = 0x32;
      }
    }
    Curl_expire(data,milli,EXPIRE_ASYNC_NAME);
  }
  return iVar5;
}

Assistant:

int Curl_resolv_getsock(struct Curl_easy *data,
                        curl_socket_t *socks)
{
#ifdef CURLRES_ASYNCH
#ifndef CURL_DISABLE_DOH
  if(data->conn->bits.doh)
    /* nothing to wait for during DoH resolve, those handles have their own
       sockets */
    return GETSOCK_BLANK;
#endif
  return Curl_resolver_getsock(data, socks);
#else
  (void)data;
  (void)socks;
  return GETSOCK_BLANK;
#endif
}